

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verParse.c
# Opt level: O3

int Ver_ParseSkipComments(Ver_Man_t *pMan)

{
  Ver_Stream_t *p;
  char cVar1;
  int iVar2;
  
  p = pMan->pReader;
  Ver_StreamSkipChars(p," \t\n\r");
  iVar2 = Ver_StreamIsOkey(pMan->pReader);
  while( true ) {
    if (iVar2 == 0) {
      return 1;
    }
    cVar1 = Ver_StreamScanChar(p);
    if (cVar1 != '/') break;
    Ver_StreamPopChar(p);
    cVar1 = Ver_StreamScanChar(p);
    if (cVar1 == '*') {
      Ver_StreamPopChar(p);
      do {
        Ver_StreamSkipToChars(p,"*");
        Ver_StreamPopChar(p);
        cVar1 = Ver_StreamScanChar(p);
      } while (cVar1 != '/');
      Ver_StreamPopChar(p);
    }
    else {
      if (cVar1 != '/') {
        builtin_strncpy(pMan->sError,"Cannot parse after symbol \"/\".",0x1f);
        Ver_ParsePrintErrorMessage(pMan);
        return 0;
      }
      Ver_StreamSkipToChars(p,"\n");
    }
    p = pMan->pReader;
    Ver_StreamSkipChars(p," \t\n\r");
    iVar2 = Ver_StreamIsOkey(pMan->pReader);
  }
  return 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Skips the comments of they are present.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Ver_ParseSkipComments( Ver_Man_t * pMan )
{
    Ver_Stream_t * p = pMan->pReader;
    char Symbol;
    // skip spaces
    Ver_StreamSkipChars( p, " \t\n\r" );
    if ( !Ver_StreamIsOkey(pMan->pReader) )
        return 1;
    // read the first symbol
    Symbol = Ver_StreamScanChar( p );
    if ( Symbol != '/' )
        return 1;
    Ver_StreamPopChar( p );
    // read the second symbol
    Symbol = Ver_StreamScanChar( p );
    if ( Symbol == '/' )
    { // skip till the end of line
        Ver_StreamSkipToChars( p, "\n" );
        return Ver_ParseSkipComments( pMan );
    }
    if ( Symbol == '*' )
    { // skip till the next occurrence of */
        Ver_StreamPopChar( p );
        do {
            Ver_StreamSkipToChars( p, "*" );
            Ver_StreamPopChar( p );
        } while ( Ver_StreamScanChar( p ) != '/' );
        Ver_StreamPopChar( p );
        return Ver_ParseSkipComments( pMan );
    }
    sprintf( pMan->sError, "Cannot parse after symbol \"/\"." );
    Ver_ParsePrintErrorMessage( pMan );
    return 0;
}